

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O3

void __thiscall Chip8::OP_FX0A(Chip8 *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LD V",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", K",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"                  ; Wait for a key press, store the value of the key in Vx.",
             0x4b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Chip8::OP_FX0A() {
    std::cout << "LD V"<<((opcode & 0x0F00u) >> 8u) << ", K" << "                  ; Wait for a key press, store the value of the key in Vx." << std::endl;
}